

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::checkbox::~checkbox(checkbox *this)

{
  ~checkbox(this,&VTT);
  base_widget::~base_widget((base_widget *)&(this->super_base_html_input).field_0x60);
  operator_delete(this);
  return;
}

Assistant:

checkbox::~checkbox()
{
}